

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

char * GetInstructionName(VmInstruction *inst)

{
  if ((ulong)inst->cmd < 0x52) {
    return &DAT_001f698c + *(int *)(&DAT_001f698c + (ulong)inst->cmd * 4);
  }
  __assert_fail("!\"unknown instruction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x215,"const char *GetInstructionName(VmInstruction *)");
}

Assistant:

const char* GetInstructionName(VmInstruction *inst)
{
	VmInstructionType cmd = inst->cmd;

	switch(cmd)
	{
	case VM_INST_LOAD_BYTE:
		return "loadb";
	case VM_INST_LOAD_SHORT:
		return "loadw";
	case VM_INST_LOAD_INT:
		return "load";
	case VM_INST_LOAD_FLOAT:
		return "loadf";
	case VM_INST_LOAD_DOUBLE:
		return "loadd";
	case VM_INST_LOAD_LONG:
		return "loadl";
	case VM_INST_LOAD_STRUCT:
		return "loads";
	case VM_INST_LOAD_IMMEDIATE:
		return "loadimm";
	case VM_INST_STORE_BYTE:
		return "storeb";
	case VM_INST_STORE_SHORT:
		return "storew";
	case VM_INST_STORE_INT:
		return "store";
	case VM_INST_STORE_FLOAT:
		return "storef";
	case VM_INST_STORE_DOUBLE:
		return "stored";
	case VM_INST_STORE_LONG:
		return "storel";
	case VM_INST_STORE_STRUCT:
		return "stores";
	case VM_INST_DOUBLE_TO_INT:
		return "dti";
	case VM_INST_DOUBLE_TO_LONG:
		return "dtl";
	case VM_INST_DOUBLE_TO_FLOAT:
		return "dtf";
	case VM_INST_INT_TO_DOUBLE:
		return "itd";
	case VM_INST_LONG_TO_DOUBLE:
		return "ltd";
	case VM_INST_INT_TO_LONG:
		return "itl";
	case VM_INST_LONG_TO_INT:
		return "lti";
	case VM_INST_INDEX:
		return "index";
	case VM_INST_INDEX_UNSIZED:
		return "indexu";
	case VM_INST_FUNCTION_ADDRESS:
		return "faddr";
	case VM_INST_TYPE_ID:
		return "typeid";
	case VM_INST_SET_RANGE:
		return "setrange";
	case VM_INST_MEM_COPY:
		return "memcopy";
	case VM_INST_JUMP:
		return "jmp";
	case VM_INST_JUMP_Z:
		return "jmpz";
	case VM_INST_JUMP_NZ:
		return "jmpnz";
	case VM_INST_CALL:
		return "call";
	case VM_INST_RETURN:
		return "ret";
	case VM_INST_YIELD:
		return "yield";
	case VM_INST_ADD:
		return "add";
	case VM_INST_SUB:
		return "sub";
	case VM_INST_MUL:
		return "mul";
	case VM_INST_DIV:
		return "div";
	case VM_INST_POW:
		return "pow";
	case VM_INST_MOD:
		return "mod";
	case VM_INST_LESS:
		return "lt";
	case VM_INST_GREATER:
		return "gt";
	case VM_INST_LESS_EQUAL:
		return "lte";
	case VM_INST_GREATER_EQUAL:
		return "gte";
	case VM_INST_EQUAL:
		return "eq";
	case VM_INST_NOT_EQUAL:
		return "neq";
	case VM_INST_SHL:
		return "shl";
	case VM_INST_SHR:
		return "shr";
	case VM_INST_BIT_AND:
		return "and";
	case VM_INST_BIT_OR:
		return "or";
	case VM_INST_BIT_XOR:
		return "xor";
	case VM_INST_ADD_LOAD:
		return "add_load";
	case VM_INST_SUB_LOAD:
		return "sub_load";
	case VM_INST_MUL_LOAD:
		return "mul_load";
	case VM_INST_DIV_LOAD:
		return "div_load";
	case VM_INST_POW_LOAD:
		return "pow_load";
	case VM_INST_MOD_LOAD:
		return "mod_load";
	case VM_INST_LESS_LOAD:
		return "lt_load";
	case VM_INST_GREATER_LOAD:
		return "gt_load";
	case VM_INST_LESS_EQUAL_LOAD:
		return "lte_load";
	case VM_INST_GREATER_EQUAL_LOAD:
		return "gte_load";
	case VM_INST_EQUAL_LOAD:
		return "eq_load";
	case VM_INST_NOT_EQUAL_LOAD:
		return "neq_load";
	case VM_INST_SHL_LOAD:
		return "shl_load";
	case VM_INST_SHR_LOAD:
		return "shr_load";
	case VM_INST_BIT_AND_LOAD:
		return "and_load";
	case VM_INST_BIT_OR_LOAD:
		return "or_load";
	case VM_INST_BIT_XOR_LOAD:
		return "xor_load";
	case VM_INST_NEG:
		return "neg";
	case VM_INST_BIT_NOT:
		return "not";
	case VM_INST_LOG_NOT:
		return "lnot";
	case VM_INST_CONVERT_POINTER:
		return "convert_pointer";
	case VM_INST_ABORT_NO_RETURN:
		return "abort_no_return";
	case VM_INST_CONSTRUCT:
		return "construct";
	case VM_INST_ARRAY:
		return "array";
	case VM_INST_EXTRACT:
		return "extract";
	case VM_INST_UNYIELD:
		return "unyield";
	case VM_INST_PHI:
		return "phi";
	case VM_INST_BITCAST:
		return "bitcast";
	case VM_INST_MOV:
		return "mov";
	case VM_INST_DEF:
		return "def";
	case VM_INST_PARALLEL_COPY:
		return "parallel_copy";
	default:
		assert(!"unknown instruction");
	}

	return "unknown";
}